

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_event.cpp
# Opt level: O0

void eco_event::efd_unset_ioevent(int efd,int fd)

{
  aco_t *paVar1;
  size_type sVar2;
  mapped_type *ppcVar3;
  key_type local_30;
  key_type local_2c;
  mapped_type local_28;
  co_io_slot_t *io;
  int *local_18;
  co_loop_t *g;
  int fd_local;
  int efd_local;
  
  g._0_4_ = fd;
  g._4_4_ = efd;
  paVar1 = aco_get_co();
  local_18 = (int *)paVar1->main_co->arg;
  io._4_4_ = (key_type)g;
  sVar2 = std::
          unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
          ::count((unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
                   *)(local_18 + 0x18),(key_type *)((long)&io + 4));
  if (sVar2 != 0) {
    local_2c = (key_type)g;
    ppcVar3 = std::
              unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
              ::operator[]((unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
                            *)(local_18 + 0x18),&local_2c);
    local_28 = *ppcVar3;
    if (local_28->recv_co != (aco_t *)0x0) {
      std::queue<aco_s_*,_std::deque<aco_s_*,_std::allocator<aco_s_*>_>_>::push
                ((queue<aco_s_*,_std::deque<aco_s_*,_std::allocator<aco_s_*>_>_> *)(local_18 + 4),
                 &local_28->recv_co);
    }
    if (local_28->send_co != (aco_t *)0x0) {
      std::queue<aco_s_*,_std::deque<aco_s_*,_std::allocator<aco_s_*>_>_>::push
                ((queue<aco_s_*,_std::deque<aco_s_*,_std::allocator<aco_s_*>_>_> *)(local_18 + 4),
                 &local_28->send_co);
    }
    local_30 = (key_type)g;
    std::
    unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
    ::erase((unordered_map<unsigned_int,_co_io_slot_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>_>
             *)(local_18 + 0x18),&local_30);
    if (local_28 != (mapped_type)0x0) {
      operator_delete(local_28);
    }
    epoll_ctl(*local_18,2,(key_type)g,(epoll_event *)0x0);
  }
  return;
}

Assistant:

void eco_event::efd_unset_ioevent(int efd, int fd)
{
  co_loop_t* g = (co_loop_t*)(aco_get_co()->main_co->arg);
  if (g->io_map.count(fd) > 0)
  {
    co_io_slot_t *io = g->io_map[fd];

    /* 如果是读事件就唤醒读 */
    if (io->recv_co)
      g->g_queue.push(io->recv_co);

    /* 如果是写事件就唤醒写 */
    if (io->send_co)
      g->g_queue.push(io->send_co);

    // 清除对象
    g->io_map.erase(fd);
    /* 清除内存 */
    delete io;

#if defined(ECO_EPOLL)
  epoll_ctl(g->efd, EPOLL_CTL_DEL, fd, nullptr);
#elif defined(ECO_KQUEUE)
  struct kevent event;
  EV_SET(&event, fd, EVFILT_WRITE, EV_DELETE, 0, 0, nullptr);
  kevent(efd, &event, 1, nullptr, 0, nullptr);
  EV_SET(&event, fd, EVFILT_READ, EV_DELETE, 0, 0, nullptr);
  kevent(efd, &event, 1, nullptr, 0, nullptr);
#endif

  }
}